

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O3

CordRepBtree *
absl::lts_20250127::cord_internal::CordRepBtree::
AddCordRep<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
          (CordRepBtree *tree,CordRep *rep)

{
  byte bVar1;
  size_t delta;
  ulong uVar2;
  CordRepBtree *pCVar3;
  ulong uVar4;
  size_t sVar5;
  Action AVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  OpResult OVar11;
  OpResult result;
  undefined8 auStack_98 [13];
  
  bVar1 = (tree->super_CordRep).storage[0];
  uVar10 = (ulong)bVar1;
  delta = rep->length;
  uVar2 = 0;
  pCVar3 = tree;
  while (uVar10 != uVar2) {
    if ((pCVar3->super_CordRep).refcount.count_.super___atomic_base<int>._M_i != 2) {
      uVar9 = (uint)uVar2;
      goto LAB_0036e92e;
    }
    auStack_98[uVar2 + 1] = pCVar3;
    uVar2 = uVar2 + 1;
    pCVar3 = (CordRepBtree *)pCVar3->edges_[(pCVar3->super_CordRep).storage[1]];
    if ((pCVar3->super_CordRep).tag != '\x03') goto LAB_0036e95f;
  }
  uVar9 = (uint)bVar1;
  uVar2 = uVar10;
LAB_0036e92e:
  iVar7 = ((pCVar3->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2) + uVar9;
  uVar8 = (uint)bVar1;
  uVar4 = (ulong)uVar9;
  if ((int)uVar9 <= (int)uVar8) {
    uVar4 = (ulong)uVar8;
  }
  do {
    if (uVar4 == uVar2) {
      sVar5 = delta;
      OVar11 = AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                         (pCVar3,(int)uVar8 < iVar7,rep,delta);
      if (uVar10 != 0) {
        uVar2 = (ulong)(bVar1 - 1);
        do {
          sVar5 = uVar10;
          uVar2 = uVar2 - 1;
          pCVar3 = (CordRepBtree *)auStack_98[sVar5];
          AVar6 = OVar11.action;
          if (AVar6 == kCopied) {
            OVar11 = SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                               (pCVar3,(long)sVar5 <= (long)iVar7,&(OVar11.tree)->super_CordRep,
                                delta);
          }
          else if (AVar6 == kPopped) {
            OVar11 = AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                               (pCVar3,(long)sVar5 <= (long)iVar7,&(OVar11.tree)->super_CordRep,
                                delta);
          }
          else if (AVar6 == kSelf) {
            (pCVar3->super_CordRep).length = (pCVar3->super_CordRep).length + delta;
            if (1 < (long)sVar5) {
              do {
                pCVar3 = (CordRepBtree *)auStack_98[(uVar2 & 0xffffffff) + 1];
                (pCVar3->super_CordRep).length = (pCVar3->super_CordRep).length + delta;
                uVar9 = (int)sVar5 - 1;
                sVar5 = (size_t)uVar9;
                uVar2 = uVar2 - 1;
              } while (1 < (int)uVar9);
            }
            return pCVar3;
          }
          uVar10 = sVar5 - 1;
        } while (1 < (long)sVar5);
      }
      result.tree = OVar11._8_8_;
      result._8_8_ = sVar5;
      pCVar3 = anon_unknown_0::
               StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>::
               Finalize((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                         *)tree,OVar11.tree,result);
      return pCVar3;
    }
    auStack_98[uVar2 + 1] = pCVar3;
    uVar2 = uVar2 + 1;
    pCVar3 = (CordRepBtree *)pCVar3->edges_[(pCVar3->super_CordRep).storage[1]];
  } while ((pCVar3->super_CordRep).tag == '\x03');
LAB_0036e95f:
  __assert_fail("IsBtree()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
}

Assistant:

CordRepBtree* CordRepBtree::AddCordRep(CordRepBtree* tree, CordRep* rep) {
  const int depth = tree->height();
  const size_t length = rep->length;
  StackOperations<edge_type> ops;
  CordRepBtree* leaf = ops.BuildStack(tree, depth);
  const OpResult result =
      leaf->AddEdge<edge_type>(ops.owned(depth), rep, length);
  return ops.Unwind(tree, depth, length, result);
}